

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O3

void __thiscall KDIS::NETWORK::Connection::startup(Connection *this)

{
  bool bVar1;
  int iVar2;
  KException *this_00;
  int *piVar3;
  KCHAR8 *__s;
  bool bVar4;
  Connection *this_01;
  long lVar5;
  allocator<char> local_39;
  KString local_38;
  
  if (this->m_iSocket[1] == 0 && this->m_iSocket[0] == 0) {
    lVar5 = 0;
    bVar1 = true;
    do {
      bVar4 = bVar1;
      iVar2 = socket(2,2,0x11);
      this->m_iSocket[lVar5] = iVar2;
      if (iVar2 == -1) {
        this_01 = (Connection *)0x30;
        this_00 = (KException *)__cxa_allocate_exception();
        piVar3 = __errno_location();
        __s = getErrorText(this_01,*piVar3);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
        KException::KException(this_00,&local_38,0xc);
        __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
      }
      lVar5 = 1;
      bVar1 = false;
    } while (bVar4);
    if (this->m_bSendOnly == false) {
      bindSocket(this);
      return;
    }
  }
  return;
}

Assistant:

void Connection::startup() noexcept(false)
{
    // Create the sockets if they do not already exist.
    if( !m_iSocket[SEND_SOCK] && !m_iSocket[RECEIVE_SOCK] )
    {
        // Windows only //
#if defined( WIN32 ) | defined( _WIN32 ) | defined( WIN64 ) | defined( _WIN64 )
        WSADATA w;
        static KINT32 iWinSockInit = WSAStartup( 0x0202, &w ); // Init with winsock version 2.2
        if( iWinSockInit != NO_ERROR )
        {
            THROW_ERROR;
        }
#endif

        // Create both sockets
        for( KINT8 i = 0; i < 2; ++i )
        {
            m_iSocket[i] = socket( AF_INET, SOCK_DGRAM, IPPROTO_UDP ); // Create a IPv4 UDP socket.

            if( m_iSocket[i] == INVALID_SOCKET )
            {
                THROW_ERROR;
            }
        }

        // Bind socket for incoming data.
        if( !m_bSendOnly )
            bindSocket();
    }
}